

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O3

double __thiscall helper::log(helper *this,double __x)

{
  LogLevel in_ESI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  __string_type __str;
  String8 local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,*(long *)this,*(long *)(this + 8) + *(long *)this);
  std::__cxx11::string::_M_replace_aux((ulong)&local_38,local_38._M_string_length,0,'\x01');
  logMultiline(&local_38,in_ESI);
  dVar1 = extraout_XMM0_Qa;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    dVar1 = extraout_XMM0_Qa_00;
  }
  return dVar1;
}

Assistant:

inline void log( const String8 &text, LogLevel level )
	{
		logMultiline( text + '\n', level );
	}